

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Data.cpp
# Opt level: O2

bool __thiscall SRUP_MSG_DATA::data(SRUP_MSG_DATA *this,uint64_t data)

{
  uint64_t *puVar1;
  
  (this->super_SRUP_MSG).m_is_serialized = false;
  if (this->m_data != (uint8_t *)0x0) {
    operator_delete__(this->m_data);
  }
  puVar1 = (uint64_t *)operator_new__(8);
  this->m_data = (uint8_t *)puVar1;
  *puVar1 = data;
  this->m_data_len = 8;
  return true;
}

Assistant:

bool SRUP_MSG_DATA::data(const uint64_t data)
{
    m_is_serialized = false;
    const uint8_t len = 8;

    delete[] m_data;

    m_data = new uint8_t[len];
    std::memcpy(m_data, &data, len);
    m_data_len = len;
    return true;
}